

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O3

int Gia_ManBmcCheckOutputs(Gia_Man_t *pFrames,int iStart,int iStop)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  
  if (iStart < iStop) {
    iVar2 = pFrames->vCos->nSize;
    uVar4 = (ulong)(uint)iStart;
    do {
      if (iVar2 - pFrames->nRegs <= (int)uVar4) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if ((iStart < 0) || (iVar2 <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = pFrames->vCos->pArray[uVar4];
      if (((long)iVar3 < 0) || (pFrames->nObjs <= iVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = pFrames->pObjs + iVar3;
      uVar5 = (uint)*(undefined8 *)pGVar1;
      if (pFrames->pObjs !=
          (Gia_Obj_t *)((ulong)(uVar5 >> 0x1d & 1) ^ (ulong)(pGVar1 + -(ulong)(uVar5 & 0x1fffffff)))
         ) {
        return 0;
      }
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < iStop);
  }
  return 1;
}

Assistant:

int Gia_ManBmcCheckOutputs( Gia_Man_t * pFrames, int iStart, int iStop )
{
    int i;
    for ( i = iStart; i < iStop; i++ )
        if ( Gia_ObjChild0(Gia_ManPo(pFrames, i)) != Gia_ManConst0(pFrames) )
            return 0;
    return 1;
}